

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O1

int little2_cdataSectionTok(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  byte bVar1;
  long lVar2;
  int iVar3;
  undefined1 uVar4;
  byte *pbVar5;
  char *pcVar6;
  ulong uVar7;
  long lVar8;
  byte bVar9;
  bool bVar10;
  
  if (end <= ptr) {
    return -4;
  }
  uVar7 = (long)end - (long)ptr & 0xfffffffffffffffe;
  pcVar6 = ptr + uVar7;
  if (uVar7 == 0) {
    pcVar6 = end;
  }
  bVar10 = ((long)end - (long)ptr & 1U) != 0;
  if (!bVar10) {
    pcVar6 = end;
  }
  if (bVar10 && uVar7 == 0) {
    return -1;
  }
  bVar1 = ptr[1];
  if (bVar1 < 0xdc) {
    uVar4 = 7;
    if (3 < bVar1 - 0xd8) {
      if (bVar1 == 0) {
        uVar4 = *(undefined1 *)((long)enc[1].scanners + (ulong)(byte)*ptr);
      }
      else {
LAB_0048f529:
        uVar4 = 0x1d;
      }
    }
  }
  else if (bVar1 - 0xdc < 4) {
    uVar4 = 8;
  }
  else {
    if ((bVar1 != 0xff) || ((byte)*ptr < 0xfe)) goto LAB_0048f529;
    uVar4 = 0;
  }
  switch(uVar4) {
  case 0:
  case 1:
  case 8:
    iVar3 = 0;
    goto LAB_0048f700;
  case 4:
    pbVar5 = (byte *)(ptr + 2);
    if ((long)pcVar6 - (long)pbVar5 < 2) {
      return -1;
    }
    if ((ptr[3] == '\0') && (*pbVar5 == 0x5d)) {
      if ((long)pcVar6 - (long)(ptr + 4) < 2) {
        return -1;
      }
      if ((ptr[5] == '\0') && (ptr[4] == '>')) {
        ptr = ptr + 6;
        iVar3 = 0x28;
        goto LAB_0048f700;
      }
    }
    break;
  case 5:
    if ((long)pcVar6 - (long)ptr < 2) {
      return -2;
    }
  default:
    pbVar5 = (byte *)(ptr + 2);
    break;
  case 6:
    if ((long)pcVar6 - (long)ptr < 3) {
      return -2;
    }
    pbVar5 = (byte *)(ptr + 3);
    break;
  case 7:
    if ((long)pcVar6 - (long)ptr < 4) {
      return -2;
    }
    pbVar5 = (byte *)(ptr + 4);
    break;
  case 9:
    pbVar5 = (byte *)(ptr + 2);
    if ((long)pcVar6 - (long)pbVar5 < 2) {
      return -1;
    }
    if (ptr[3] == '\0') {
      bVar10 = *(char *)((long)enc[1].scanners + (ulong)*pbVar5) == '\n';
    }
    else {
      bVar10 = false;
    }
    ptr = ptr + 4;
    if (!bVar10) {
      ptr = (char *)pbVar5;
    }
    goto LAB_0048f6fb;
  case 10:
    ptr = ptr + 2;
LAB_0048f6fb:
    iVar3 = 7;
    goto LAB_0048f700;
  }
  iVar3 = 6;
  for (ptr = (char *)pbVar5; lVar2 = (long)pcVar6 - (long)ptr, 1 < lVar2;
      ptr = (char *)((byte *)ptr + lVar8)) {
    bVar1 = ((byte *)ptr)[1];
    if (bVar1 < 0xdc) {
      bVar9 = 7;
      if (3 < bVar1 - 0xd8) {
        if (bVar1 == 0) {
          bVar9 = *(byte *)((long)enc[1].scanners + (ulong)(byte)*ptr);
        }
        else {
LAB_0048f684:
          bVar9 = 0x1d;
        }
      }
    }
    else if (bVar1 - 0xdc < 4) {
      bVar9 = 8;
    }
    else {
      if ((bVar1 != 0xff) || ((byte)*ptr < 0xfe)) goto LAB_0048f684;
      bVar9 = 0;
    }
    lVar8 = 2;
    if (bVar9 < 0xb) {
      if (bVar9 == 6) {
        lVar8 = 3;
        if (lVar2 == 2) break;
      }
      else if (bVar9 == 7) {
        lVar8 = 4;
        if (lVar2 < 4) break;
      }
      else if ((0x713U >> (bVar9 & 0x1f) & 1) != 0) break;
    }
  }
LAB_0048f700:
  *nextTokPtr = ptr;
  return iVar3;
}

Assistant:

static int PTRCALL
PREFIX(cdataSectionTok)(const ENCODING *enc, const char *ptr,
                        const char *end, const char **nextTokPtr)
{
  if (ptr >= end)
    return XML_TOK_NONE;
  if (MINBPC(enc) > 1) {
    size_t n = end - ptr;
    if (n & (MINBPC(enc) - 1)) {
      n &= ~(MINBPC(enc) - 1);
      if (n == 0)
        return XML_TOK_PARTIAL;
      end = ptr + n;
    }
  }
  switch (BYTE_TYPE(enc, ptr)) {
  case BT_RSQB:
    ptr += MINBPC(enc);
    REQUIRE_CHAR(enc, ptr, end);
    if (!CHAR_MATCHES(enc, ptr, ASCII_RSQB))
      break;
    ptr += MINBPC(enc);
    REQUIRE_CHAR(enc, ptr, end);
    if (!CHAR_MATCHES(enc, ptr, ASCII_GT)) {
      ptr -= MINBPC(enc);
      break;
    }
    *nextTokPtr = ptr + MINBPC(enc);
    return XML_TOK_CDATA_SECT_CLOSE;
  case BT_CR:
    ptr += MINBPC(enc);
    REQUIRE_CHAR(enc, ptr, end);
    if (BYTE_TYPE(enc, ptr) == BT_LF)
      ptr += MINBPC(enc);
    *nextTokPtr = ptr;
    return XML_TOK_DATA_NEWLINE;
  case BT_LF:
    *nextTokPtr = ptr + MINBPC(enc);
    return XML_TOK_DATA_NEWLINE;
  INVALID_CASES(ptr, nextTokPtr)
  default:
    ptr += MINBPC(enc);
    break;
  }
  while (HAS_CHAR(enc, ptr, end)) {
    switch (BYTE_TYPE(enc, ptr)) {
#define LEAD_CASE(n) \
    case BT_LEAD ## n: \
      if (end - ptr < n || IS_INVALID_CHAR(enc, ptr, n)) { \
        *nextTokPtr = ptr; \
        return XML_TOK_DATA_CHARS; \
      } \
      ptr += n; \
      break;
    LEAD_CASE(2) LEAD_CASE(3) LEAD_CASE(4)
#undef LEAD_CASE
    case BT_NONXML:
    case BT_MALFORM:
    case BT_TRAIL:
    case BT_CR:
    case BT_LF:
    case BT_RSQB:
      *nextTokPtr = ptr;
      return XML_TOK_DATA_CHARS;
    default:
      ptr += MINBPC(enc);
      break;
    }
  }
  *nextTokPtr = ptr;
  return XML_TOK_DATA_CHARS;
}